

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::EnqueueSignal
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IFence *pFence,Uint64 Value,
          int param_3)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  int param_3_local;
  Uint64 Value_local;
  IFence *pFence_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_3;
  bVar1 = IsDeferred(this);
  if (bVar1) {
    FormatString<char[57]>
              ((string *)local_48,
               (char (*) [57])"Fence signal can only be enqueued from immediate context");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a4);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (pFence == (IFence *)0x0) {
    FormatString<char[23]>((string *)local_78,(char (*) [23])"Fence must not be null");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a5);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EnqueueSignal(IFence* pFence, Uint64 Value, int)
{
    DEV_CHECK_ERR(!IsDeferred(), "Fence signal can only be enqueued from immediate context");
    DEV_CHECK_ERR(pFence != nullptr, "Fence must not be null");
}